

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void __thiscall CEditorImage::AnalyzeTileFlags(CEditorImage *this)

{
  uchar *__s;
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int local_54;
  
  __s = this->m_aTileFlags;
  if ((this->super_CImageInfo).m_Format == 0) {
    memset(__s,4,0x100);
    return;
  }
  mem_zero(__s,0x100);
  iVar1 = (this->super_CImageInfo).m_Width;
  iVar6 = iVar1 + 0xf;
  if (-1 < iVar1) {
    iVar6 = iVar1;
  }
  iVar2 = (this->super_CImageInfo).m_Height;
  iVar6 = iVar6 >> 4;
  iVar9 = iVar2 + 0xf;
  if (-1 < iVar2) {
    iVar9 = iVar2;
  }
  if (iVar6 == iVar9 >> 4) {
    pvVar4 = (this->super_CImageInfo).m_pData;
    local_54 = 0;
    lVar11 = 0;
    lVar14 = 0;
    do {
      lVar14 = (long)(int)lVar14;
      iVar8 = 0;
      iVar17 = 0;
      do {
        if (iVar1 < 0x10) {
LAB_00194582:
          __s[lVar14] = __s[lVar14] | 4;
        }
        else {
          iVar3 = (this->super_CImageInfo).m_Width;
          iVar10 = (local_54 * iVar3 + iVar8) * 4 + 3;
          bVar12 = true;
          bVar13 = true;
          iVar16 = 0;
          do {
            if (0xf < iVar2) {
              lVar7 = 1;
              iVar15 = iVar10;
              do {
                if (*(byte *)((long)pvVar4 + (long)iVar15) < 0xfa) {
                  bVar12 = false;
                  bVar13 = bVar12;
                  break;
                }
                iVar15 = iVar15 + iVar3 * 4;
                bVar5 = lVar7 < iVar9 >> 4;
                lVar7 = lVar7 + 1;
                bVar13 = bVar12;
              } while (bVar5);
            }
            iVar16 = iVar16 + 1;
            iVar10 = iVar10 + 4;
          } while (iVar16 != iVar6);
          if (bVar13) goto LAB_00194582;
        }
        iVar17 = iVar17 + 1;
        lVar14 = lVar14 + 1;
        iVar8 = iVar8 + iVar6;
      } while (iVar17 != 0x10);
      lVar11 = lVar11 + 1;
      local_54 = local_54 + iVar6;
    } while (lVar11 != 0x10);
  }
  return;
}

Assistant:

void CEditorImage::AnalyzeTileFlags()
{
	if(m_Format == CImageInfo::FORMAT_RGB)
	{
		for(int i = 0; i < 256; ++i)
			m_aTileFlags[i] = TILEFLAG_OPAQUE;
	}
	else
	{
		mem_zero(m_aTileFlags, sizeof(m_aTileFlags));

		int tw = m_Width/16; // tilesizes
		int th = m_Height/16;
		if(tw == th)
		{
			unsigned char *pPixelData = (unsigned char *)m_pData;

			int TileID = 0;
			for(int ty = 0; ty < 16; ty++)
				for(int tx = 0; tx < 16; tx++, TileID++)
				{
					bool Opaque = true;
					for(int x = 0; x < tw; x++)
						for(int y = 0; y < th; y++)
						{
							int p = (ty*tw+y)*m_Width + tx*tw+x;
							if(pPixelData[p*4+3] < 250)
							{
								Opaque = false;
								break;
							}
						}

					if(Opaque)
						m_aTileFlags[TileID] |= TILEFLAG_OPAQUE;
				}
		}
	}
}